

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

optional<std::pair<XOnlyPubKey,_bool>_> * __thiscall
XOnlyPubKey::CreateTapTweak(XOnlyPubKey *this,uint256 *merkle_root)

{
  long lVar1;
  int iVar2;
  secp256k1_xonly_pubkey *in_RSI;
  optional<std::pair<XOnlyPubKey,_bool>_> *in_RDI;
  long in_FS_OFFSET;
  int parity;
  secp256k1_xonly_pubkey out_xonly;
  pair<XOnlyPubKey,_bool> ret;
  uint256 tweak;
  secp256k1_pubkey out;
  secp256k1_xonly_pubkey base_point;
  pair<XOnlyPubKey,_bool> *in_stack_fffffffffffffe98;
  secp256k1_context *__t;
  undefined7 in_stack_fffffffffffffea8;
  uint256 *in_stack_fffffffffffffeb0;
  optional<std::pair<XOnlyPubKey,_bool>_> *this_00;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar3;
  undefined4 in_stack_fffffffffffffef4;
  secp256k1_context *in_stack_fffffffffffffef8;
  secp256k1_xonly_pubkey *in_stack_ffffffffffffff00;
  secp256k1_context *in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff18;
  secp256k1_xonly_pubkey *in_stack_ffffffffffffff20;
  secp256k1_context *in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  data(&in_stack_fffffffffffffe98->first);
  iVar2 = secp256k1_xonly_pubkey_parse
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (iVar2 == 0) {
    std::optional<std::pair<XOnlyPubKey,_bool>_>::optional(this_00);
  }
  else {
    ComputeTapTweakHash((XOnlyPubKey *)this_00,in_stack_fffffffffffffeb0);
    base_blob<256U>::data((base_blob<256U> *)in_stack_fffffffffffffe98);
    iVar2 = secp256k1_xonly_pubkey_tweak_add
                      (in_stack_ffffffffffffff08,(secp256k1_pubkey *)in_stack_ffffffffffffff00,
                       (secp256k1_xonly_pubkey *)in_stack_fffffffffffffef8,
                       (uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (iVar2 == 0) {
      std::optional<std::pair<XOnlyPubKey,_bool>_>::optional(this_00);
    }
    else {
      uVar3 = 0xffffffff;
      std::pair<XOnlyPubKey,_bool>::pair<XOnlyPubKey,_bool,_true>(in_stack_fffffffffffffe98);
      iVar2 = secp256k1_xonly_pubkey_from_pubkey
                        (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                         (int *)in_stack_fffffffffffffef8,
                         (secp256k1_pubkey *)CONCAT44(in_stack_fffffffffffffef4,uVar3));
      if (iVar2 == 0) {
        std::optional<std::pair<XOnlyPubKey,_bool>_>::optional(this_00);
      }
      else {
        __t = secp256k1_context_static;
        begin(&in_stack_fffffffffffffe98->first);
        secp256k1_xonly_pubkey_serialize
                  (in_stack_fffffffffffffef8,(uchar *)CONCAT44(in_stack_fffffffffffffef4,uVar3),
                   in_RSI);
        if (1 < uVar3) {
          __assert_fail("parity == 0 || parity == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                        ,0x10c,
                        "std::optional<std::pair<XOnlyPubKey, bool>> XOnlyPubKey::CreateTapTweak(const uint256 *) const"
                       );
        }
        std::optional<std::pair<XOnlyPubKey,_bool>_>::optional<std::pair<XOnlyPubKey,_bool>,_true>
                  ((optional<std::pair<XOnlyPubKey,_bool>_> *)
                   CONCAT17(uVar3 < 2,in_stack_fffffffffffffea8),(pair<XOnlyPubKey,_bool> *)__t);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<XOnlyPubKey, bool>> XOnlyPubKey::CreateTapTweak(const uint256* merkle_root) const
{
    secp256k1_xonly_pubkey base_point;
    if (!secp256k1_xonly_pubkey_parse(secp256k1_context_static, &base_point, data())) return std::nullopt;
    secp256k1_pubkey out;
    uint256 tweak = ComputeTapTweakHash(merkle_root);
    if (!secp256k1_xonly_pubkey_tweak_add(secp256k1_context_static, &out, &base_point, tweak.data())) return std::nullopt;
    int parity = -1;
    std::pair<XOnlyPubKey, bool> ret;
    secp256k1_xonly_pubkey out_xonly;
    if (!secp256k1_xonly_pubkey_from_pubkey(secp256k1_context_static, &out_xonly, &parity, &out)) return std::nullopt;
    secp256k1_xonly_pubkey_serialize(secp256k1_context_static, ret.first.begin(), &out_xonly);
    assert(parity == 0 || parity == 1);
    ret.second = parity;
    return ret;
}